

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Own<kj::_::PromiseNode> *params_1;
  Task *pTVar1;
  Task *pTVar2;
  Maybe<kj::Own<kj::TaskSet::Task>_> *other;
  Own<kj::TaskSet::Task> *t;
  Maybe<kj::Own<kj::TaskSet::Task>_> local_50 [2];
  Own<kj::TaskSet::Task> *local_30;
  Own<kj::TaskSet::Task> *head;
  Own<kj::TaskSet::Task> task;
  Promise<void> *promise_local;
  TaskSet *this_local;
  
  task.ptr = (Task *)promise;
  params_1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)promise);
  heap<kj::TaskSet::Task,kj::TaskSet&,kj::Own<kj::_::PromiseNode>>((kj *)&head,this,params_1);
  local_30 = _::readMaybe<kj::TaskSet::Task>(&this->tasks);
  if (local_30 != (Own<kj::TaskSet::Task> *)0x0) {
    pTVar1 = Own<kj::TaskSet::Task>::operator->((Own<kj::TaskSet::Task> *)&head);
    pTVar2 = Own<kj::TaskSet::Task>::get(local_30);
    pTVar2->prev = &pTVar1->next;
    other = mv<kj::Maybe<kj::Own<kj::TaskSet::Task>>>(&this->tasks);
    pTVar1 = Own<kj::TaskSet::Task>::operator->((Own<kj::TaskSet::Task> *)&head);
    Maybe<kj::Own<kj::TaskSet::Task>_>::operator=(&pTVar1->next,other);
  }
  pTVar1 = Own<kj::TaskSet::Task>::operator->((Own<kj::TaskSet::Task> *)&head);
  pTVar1->prev = &this->tasks;
  t = mv<kj::Own<kj::TaskSet::Task>>((Own<kj::TaskSet::Task> *)&head);
  Maybe<kj::Own<kj::TaskSet::Task>_>::Maybe(local_50,t);
  Maybe<kj::Own<kj::TaskSet::Task>_>::operator=(&this->tasks,local_50);
  Maybe<kj::Own<kj::TaskSet::Task>_>::~Maybe(local_50);
  Own<kj::TaskSet::Task>::~Own((Own<kj::TaskSet::Task> *)&head);
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = heap<Task>(*this, kj::mv(promise.node));
  KJ_IF_MAYBE(head, tasks) {
    head->get()->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}